

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Fill::toString_abi_cxx11_(string *__return_storage_ptr__,Fill *this,Layout *layout)

{
  string *in_R8;
  stringstream ss;
  allocator local_222;
  allocator local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0 [32];
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string(local_1e0,"fill",&local_221);
  Color::toString_abi_cxx11_(&local_200,&this->color,layout);
  std::__cxx11::string::string((string *)&local_220,"",&local_222);
  attribute<std::__cxx11::string>(&local_1c0,(svg *)local_1e0,&local_200,&local_220,in_R8);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("fill", color.toString(layout));
            return ss.str();
        }